

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_growable_writer_teardown(mpack_writer_t *writer)

{
  char *pcVar1;
  ulong uVar2;
  
  if (writer->error == mpack_ok) {
    pcVar1 = writer->buffer;
    uVar2 = (long)writer->current - (long)pcVar1;
    if (uVar2 < (ulong)((long)writer->end - (long)pcVar1) >> 1) {
      pcVar1 = (char *)realloc(pcVar1,uVar2 + (uVar2 == 0));
      if (pcVar1 == (char *)0x0) {
        free(writer->buffer);
        if (writer->error == mpack_ok) {
          writer->error = mpack_error_memory;
          if (writer->error_fn != (mpack_writer_error_t)0x0) {
            (*writer->error_fn)(writer,mpack_error_memory);
          }
        }
      }
      else {
        writer->buffer = pcVar1;
        writer->current = pcVar1 + uVar2;
        writer->end = pcVar1 + uVar2;
      }
      if (pcVar1 == (char *)0x0) {
        return;
      }
    }
    *(char **)writer->reserved[0] = writer->buffer;
    *(long *)writer->reserved[1] = (long)writer->current - (long)writer->buffer;
  }
  else {
    if (writer->buffer == (char *)0x0) goto LAB_00105eba;
    free(writer->buffer);
  }
  writer->buffer = (char *)0x0;
LAB_00105eba:
  writer->context = (void *)0x0;
  return;
}

Assistant:

static void mpack_growable_writer_teardown(mpack_writer_t* writer) {
    mpack_growable_writer_t* growable_writer = (mpack_growable_writer_t*)mpack_writer_get_reserved(writer);

    if (mpack_writer_error(writer) == mpack_ok) {

        // shrink the buffer to an appropriate size if the data is
        // much smaller than the buffer
        if (mpack_writer_buffer_used(writer) < mpack_writer_buffer_size(writer) / 2) {
            size_t used = mpack_writer_buffer_used(writer);

            // We always return a non-null pointer that must be freed, even if
            // nothing was written. malloc() and realloc() do not necessarily
            // do this so we enforce it ourselves.
            size_t size = (used != 0) ? used : 1;

            char* buffer = (char*)mpack_realloc(writer->buffer, used, size);
            if (!buffer) {
                MPACK_FREE(writer->buffer);
                mpack_writer_flag_error(writer, mpack_error_memory);
                return;
            }
            writer->buffer = buffer;
            writer->end = (writer->current = writer->buffer + used);
        }

        *growable_writer->target_data = writer->buffer;
        *growable_writer->target_size = mpack_writer_buffer_used(writer);
        writer->buffer = NULL;

    } else if (writer->buffer) {
        MPACK_FREE(writer->buffer);
        writer->buffer = NULL;
    }

    writer->context = NULL;
}